

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::MemoryStressCase::MemoryStressCase
          (MemoryStressCase *this,EglTestContext *eglTestCtx,Spec spec,char *name,char *description)

{
  Spec SVar1;
  deUint32 dVar2;
  char *description_local;
  char *name_local;
  EglTestContext *eglTestCtx_local;
  MemoryStressCase *this_local;
  
  SVar1 = spec;
  TestCase::TestCase(&this->super_TestCase,eglTestCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MemoryStressCase_006717f0;
  (this->m_spec).maxHeight = spec.maxHeight;
  (this->m_spec).use = spec.use;
  *(undefined3 *)&(this->m_spec).field_0x15 = spec._21_3_;
  spec._0_8_ = SVar1._0_8_;
  spec._8_8_ = SVar1._8_8_;
  (this->m_spec).types = spec.types;
  (this->m_spec).minWidth = spec.minWidth;
  (this->m_spec).minHeight = spec.minHeight;
  (this->m_spec).maxWidth = spec.maxWidth;
  std::vector<int,_std::allocator<int>_>::vector(&this->m_allocationCounts);
  this->m_allocator = (MemoryAllocator *)0x0;
  this->m_iteration = 0;
  this->m_iterationCount = 10;
  dVar2 = deStringHash(name);
  this->m_seed = dVar2;
  this->m_display = (EGLDisplay)0x0;
  this->m_config = (EGLConfig)0x0;
  return;
}

Assistant:

MemoryStressCase::MemoryStressCase (EglTestContext& eglTestCtx, Spec spec, const char* name, const char* description)
	: TestCase			(eglTestCtx, name, description)
	, m_spec			(spec)
	, m_allocator		(NULL)
	, m_iteration		(0)
	, m_iterationCount	(10)
	, m_seed			(deStringHash(name))
	, m_display			(EGL_NO_DISPLAY)
	, m_config			(DE_NULL)
{
}